

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O0

long intval(vm_val_t *val,long minval,long maxval,int pct,unsigned_long mask)

{
  int iVar1;
  uint32_t uVar2;
  int32_t iVar3;
  ulong uVar4;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  int *in_RDI;
  ulong in_R8;
  int ov;
  long l;
  int iVar5;
  int in_stack_ffffffffffffffcc;
  vm_val_t *in_stack_ffffffffffffffd0;
  
  iVar5 = *in_RDI;
  if (iVar5 == 1) {
    uVar4 = 0;
  }
  else {
    if (iVar5 == 5) {
      iVar1 = CVmObjBigNum::is_bignum_obj(0);
      if (iVar1 != 0) {
        if (in_RSI < 0) {
          vm_objp(0);
          iVar3 = CVmObjBigNum::convert_to_int
                            ((CVmObjBigNum *)in_stack_ffffffffffffffd0,
                             (int *)CONCAT44(in_stack_ffffffffffffffcc,iVar5));
          uVar4 = (ulong)iVar3;
        }
        else {
          vm_objp(0);
          uVar2 = CVmObjBigNum::convert_to_uint
                            ((CVmObjBigNum *)in_stack_ffffffffffffffd0,
                             (int *)CONCAT44(in_stack_ffffffffffffffcc,iVar5));
          uVar4 = (ulong)uVar2;
        }
        if ((in_stack_ffffffffffffffcc != 0) && (in_ECX == 0)) {
          err_throw(0);
        }
        goto LAB_0037c3f0;
      }
    }
    else if (iVar5 == 7) {
      uVar4 = (ulong)in_RDI[2];
      goto LAB_0037c3f0;
    }
    iVar3 = vm_val_t::cast_to_int(in_stack_ffffffffffffffd0);
    uVar4 = (ulong)iVar3;
  }
LAB_0037c3f0:
  if (in_ECX == 0) {
    if (((long)uVar4 < in_RSI) || (in_RDX < (long)uVar4)) {
      err_throw(0);
    }
  }
  else {
    uVar4 = in_R8 & uVar4;
  }
  return uVar4;
}

Assistant:

static long intval(VMG_ const vm_val_t *val, long minval, long maxval,
                   int pct, unsigned long mask)
{
    /* get the value */
    long l;
    switch (val->typ)
    {
    case VM_NIL:
        /* use 0 for nil */
        l = 0;
        break;

    case VM_INT:
        /* regular integer */
        l = val->val.intval;
        break;

    case VM_OBJ:
        /* 
         *   convert BigNumber to integer explicitly; use the type cast for
         *   other types 
         */
        if (CVmObjBigNum::is_bignum_obj(vmg_ val->val.obj))
        {
            /* explicitly cast the BigNumber so that we can catch overflows */
            int ov;
            if (minval < 0)
            {
                l = ((CVmObjBigNum *)vm_objp(vmg_ val->val.obj))
                    ->convert_to_int(ov);
            }
            else
            {
                l = (long)((CVmObjBigNum *)vm_objp(vmg_ val->val.obj))
                    ->convert_to_uint(ov);
            }

            /* check for overflow */
            if (ov && !pct)
                err_throw(VMERR_NUM_OVERFLOW);;

            /* done */
            break;
        }
        /* FALL THROUGH to default */

    default:
        /* use the generic type cast */
        l = val->cast_to_int(vmg0_);
        break;
    }